

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * json_object_getn_value(JSON_Object *object,char *name,size_t name_len)

{
  size_t sVar1;
  size_t item_ix;
  size_t cell_ix;
  unsigned_long uStack_30;
  parson_bool_t found;
  unsigned_long hash;
  size_t name_len_local;
  char *name_local;
  JSON_Object *object_local;
  
  uStack_30 = 0;
  cell_ix._4_4_ = 0;
  if ((object == (JSON_Object *)0x0) || (name == (char *)0x0)) {
    object_local = (JSON_Object *)0x0;
  }
  else {
    hash = name_len;
    name_len_local = (size_t)name;
    name_local = (char *)object;
    uStack_30 = hash_string(name,name_len);
    cell_ix._4_4_ = 0;
    sVar1 = json_object_get_cell_ix
                      ((JSON_Object *)name_local,(char *)name_len_local,hash,uStack_30,
                       (parson_bool_t *)((long)&cell_ix + 4));
    if (cell_ix._4_4_ == 0) {
      object_local = (JSON_Object *)0x0;
    }
    else {
      object_local = *(JSON_Object **)
                      (*(long *)(name_local + 0x20) +
                      *(long *)(*(long *)(name_local + 8) + sVar1 * 8) * 8);
    }
  }
  return (JSON_Value *)object_local;
}

Assistant:

static JSON_Value * json_object_getn_value(const JSON_Object *object, const char *name, size_t name_len) {
    unsigned long hash = 0;
    parson_bool_t found = PARSON_FALSE;
    size_t cell_ix = 0;
    size_t item_ix = 0;
    if (!object || !name) {
        return NULL;
    }
    hash = hash_string(name, name_len);
    found = PARSON_FALSE;
    cell_ix = json_object_get_cell_ix(object, name, name_len, hash, &found);
    if (!found) {
        return NULL;
    }
    item_ix = object->cells[cell_ix];
    return object->values[item_ix];
}